

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

uint32_t get_error_values(int inc,int top,char **file,int *line,char **data,int *flags)

{
  ERR_STATE *pEVar1;
  err_error_st *error_00;
  uint32_t ret;
  err_error_st *error;
  ERR_STATE *state;
  uint i;
  int *flags_local;
  char **data_local;
  int *line_local;
  char **file_local;
  int top_local;
  int inc_local;
  
  pEVar1 = err_get_state();
  if ((pEVar1 == (ERR_STATE *)0x0) || (pEVar1->bottom == pEVar1->top)) {
    top_local = 0;
  }
  else {
    if (top == 0) {
      state._4_4_ = pEVar1->bottom + 1 & 0xf;
    }
    else {
      if (inc != 0) {
        __assert_fail("!inc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err.cc"
                      ,0x9c,
                      "uint32_t get_error_values(int, int, const char **, int *, const char **, int *)"
                     );
      }
      state._4_4_ = pEVar1->top;
    }
    error_00 = pEVar1->errors + state._4_4_;
    top_local = error_00->packed;
    if ((file != (char **)0x0) && (line != (int *)0x0)) {
      if (error_00->file == (char *)0x0) {
        *file = "NA";
        *line = 0;
      }
      else {
        *file = error_00->file;
        *line = (uint)error_00->line;
      }
    }
    if (data != (char **)0x0) {
      if (error_00->data == (char *)0x0) {
        *data = "";
        if (flags != (int *)0x0) {
          *flags = 0;
        }
      }
      else {
        *data = error_00->data;
        if (flags != (int *)0x0) {
          *flags = 3;
        }
        if (inc != 0) {
          if (error_00->data != (char *)0x0) {
            free(pEVar1->to_free);
            pEVar1->to_free = error_00->data;
          }
          error_00->data = (char *)0x0;
        }
      }
    }
    if (inc != 0) {
      if (top != 0) {
        __assert_fail("!top",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err.cc"
                      ,0xce,
                      "uint32_t get_error_values(int, int, const char **, int *, const char **, int *)"
                     );
      }
      err_clear(error_00);
      pEVar1->bottom = state._4_4_;
    }
  }
  return top_local;
}

Assistant:

static uint32_t get_error_values(int inc, int top, const char **file, int *line,
                                 const char **data, int *flags) {
  unsigned i = 0;
  ERR_STATE *state;
  struct err_error_st *error;
  uint32_t ret;

  state = err_get_state();
  if (state == NULL || state->bottom == state->top) {
    return 0;
  }

  if (top) {
    assert(!inc);
    // last error
    i = state->top;
  } else {
    i = (state->bottom + 1) % ERR_NUM_ERRORS;
  }

  error = &state->errors[i];
  ret = error->packed;

  if (file != NULL && line != NULL) {
    if (error->file == NULL) {
      *file = "NA";
      *line = 0;
    } else {
      *file = error->file;
      *line = error->line;
    }
  }

  if (data != NULL) {
    if (error->data == NULL) {
      *data = "";
      if (flags != NULL) {
        *flags = 0;
      }
    } else {
      *data = error->data;
      if (flags != NULL) {
        // Without |ERR_FLAG_MALLOCED|, rust-openssl assumes the string has a
        // static lifetime. In both cases, we retain ownership of the string,
        // and the caller is not expected to free it.
        *flags = ERR_FLAG_STRING | ERR_FLAG_MALLOCED;
      }
      // If this error is being removed, take ownership of data from
      // the error. The semantics are such that the caller doesn't
      // take ownership either. Instead the error system takes
      // ownership and retains it until the next call that affects the
      // error queue.
      if (inc) {
        if (error->data != NULL) {
          free(state->to_free);
          state->to_free = error->data;
        }
        error->data = NULL;
      }
    }
  }

  if (inc) {
    assert(!top);
    err_clear(error);
    state->bottom = i;
  }

  return ret;
}